

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O0

GLenum __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::getDestinationFormatForChannel
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor)

{
  TextureInternalFormatDescriptor descriptor_00;
  TextureInternalFormatDescriptor descriptor_01;
  TextureInternalFormatDescriptor descriptor_02;
  TextureInternalFormatDescriptor descriptor_03;
  TextureInternalFormatDescriptor descriptor_04;
  bool bVar1;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  FunctionalTest *local_18;
  FunctionalTest *this_local;
  
  local_18 = this;
  memcpy(&local_58,&descriptor,0x40);
  descriptor_00.internal_format_name = (GLchar *)uStack_50;
  descriptor_00.required_by_context.super_ApiType.m_bits = (ApiType)(ApiType)(undefined4)local_58;
  descriptor_00.internal_format = local_58._4_4_;
  descriptor_00.is_sRGB = (bool)(undefined1)local_48;
  descriptor_00.is_color_renderable = (bool)local_48._1_1_;
  descriptor_00._18_2_ = local_48._2_2_;
  descriptor_00.min_red_size = local_48._4_4_;
  descriptor_00.min_green_size = (undefined4)uStack_40;
  descriptor_00.min_blue_size = uStack_40._4_4_;
  descriptor_00.min_alpha_size = (undefined4)local_38;
  descriptor_00.min_depth_size = local_38._4_4_;
  descriptor_00.min_stencil_size = (undefined4)uStack_30;
  descriptor_00.expected_red_type = uStack_30._4_4_;
  descriptor_00.expected_green_type = (undefined4)local_28;
  descriptor_00.expected_blue_type = local_28._4_4_;
  descriptor_00.expected_alpha_type = (undefined4)uStack_20;
  descriptor_00.expected_depth_type = uStack_20._4_4_;
  bVar1 = isFloatType(this,descriptor_00);
  if (bVar1) {
    this_local._4_4_ = 0x822e;
  }
  else {
    memcpy(&local_98,&descriptor,0x40);
    descriptor_01.internal_format_name = (GLchar *)uStack_90;
    descriptor_01.required_by_context.super_ApiType.m_bits = (ApiType)(ApiType)(undefined4)local_98;
    descriptor_01.internal_format = local_98._4_4_;
    descriptor_01.is_sRGB = (bool)(undefined1)local_88;
    descriptor_01.is_color_renderable = (bool)local_88._1_1_;
    descriptor_01._18_2_ = local_88._2_2_;
    descriptor_01.min_red_size = local_88._4_4_;
    descriptor_01.min_green_size = (undefined4)uStack_80;
    descriptor_01.min_blue_size = uStack_80._4_4_;
    descriptor_01.min_alpha_size = (undefined4)local_78;
    descriptor_01.min_depth_size = local_78._4_4_;
    descriptor_01.min_stencil_size = (undefined4)uStack_70;
    descriptor_01.expected_red_type = uStack_70._4_4_;
    descriptor_01.expected_green_type = (undefined4)local_68;
    descriptor_01.expected_blue_type = local_68._4_4_;
    descriptor_01.expected_alpha_type = (undefined4)uStack_60;
    descriptor_01.expected_depth_type = uStack_60._4_4_;
    bVar1 = isFixedUnsignedType(this,descriptor_01);
    if (bVar1) {
      this_local._4_4_ = 0x822a;
    }
    else {
      memcpy(&local_d8,&descriptor,0x40);
      descriptor_02.internal_format_name = (GLchar *)uStack_d0;
      descriptor_02.required_by_context.super_ApiType.m_bits =
           (ApiType)(ApiType)(undefined4)local_d8;
      descriptor_02.internal_format = local_d8._4_4_;
      descriptor_02.is_sRGB = (bool)(undefined1)local_c8;
      descriptor_02.is_color_renderable = (bool)local_c8._1_1_;
      descriptor_02._18_2_ = local_c8._2_2_;
      descriptor_02.min_red_size = local_c8._4_4_;
      descriptor_02.min_green_size = (undefined4)uStack_c0;
      descriptor_02.min_blue_size = uStack_c0._4_4_;
      descriptor_02.min_alpha_size = (undefined4)local_b8;
      descriptor_02.min_depth_size = local_b8._4_4_;
      descriptor_02.min_stencil_size = (undefined4)uStack_b0;
      descriptor_02.expected_red_type = uStack_b0._4_4_;
      descriptor_02.expected_green_type = (undefined4)local_a8;
      descriptor_02.expected_blue_type = local_a8._4_4_;
      descriptor_02.expected_alpha_type = (undefined4)uStack_a0;
      descriptor_02.expected_depth_type = uStack_a0._4_4_;
      bVar1 = isFixedSignedType(this,descriptor_02);
      if (bVar1) {
        this_local._4_4_ = 0x8f98;
      }
      else {
        memcpy(&local_118,&descriptor,0x40);
        descriptor_03.internal_format_name = (GLchar *)uStack_110;
        descriptor_03.required_by_context.super_ApiType.m_bits =
             (ApiType)(ApiType)(undefined4)local_118;
        descriptor_03.internal_format = local_118._4_4_;
        descriptor_03.is_sRGB = (bool)(undefined1)local_108;
        descriptor_03.is_color_renderable = (bool)local_108._1_1_;
        descriptor_03._18_2_ = local_108._2_2_;
        descriptor_03.min_red_size = local_108._4_4_;
        descriptor_03.min_green_size = (undefined4)uStack_100;
        descriptor_03.min_blue_size = uStack_100._4_4_;
        descriptor_03.min_alpha_size = (undefined4)local_f8;
        descriptor_03.min_depth_size = local_f8._4_4_;
        descriptor_03.min_stencil_size = (undefined4)uStack_f0;
        descriptor_03.expected_red_type = uStack_f0._4_4_;
        descriptor_03.expected_green_type = (undefined4)local_e8;
        descriptor_03.expected_blue_type = local_e8._4_4_;
        descriptor_03.expected_alpha_type = (undefined4)uStack_e0;
        descriptor_03.expected_depth_type = uStack_e0._4_4_;
        bVar1 = isIntegerUnsignedType(this,descriptor_03);
        if (bVar1) {
          this_local._4_4_ = 0x8236;
        }
        else {
          memcpy(&local_158,&descriptor,0x40);
          descriptor_04.internal_format_name = (GLchar *)uStack_150;
          descriptor_04.required_by_context.super_ApiType.m_bits =
               (ApiType)(ApiType)(undefined4)local_158;
          descriptor_04.internal_format = local_158._4_4_;
          descriptor_04.is_sRGB = (bool)(undefined1)local_148;
          descriptor_04.is_color_renderable = (bool)local_148._1_1_;
          descriptor_04._18_2_ = local_148._2_2_;
          descriptor_04.min_red_size = local_148._4_4_;
          descriptor_04.min_green_size = (undefined4)uStack_140;
          descriptor_04.min_blue_size = uStack_140._4_4_;
          descriptor_04.min_alpha_size = (undefined4)local_138;
          descriptor_04.min_depth_size = local_138._4_4_;
          descriptor_04.min_stencil_size = (undefined4)uStack_130;
          descriptor_04.expected_red_type = uStack_130._4_4_;
          descriptor_04.expected_green_type = (undefined4)local_128;
          descriptor_04.expected_blue_type = local_128._4_4_;
          descriptor_04.expected_alpha_type = (undefined4)uStack_120;
          descriptor_04.expected_depth_type = uStack_120._4_4_;
          bVar1 = isIntegerSignedType(this,descriptor_04);
          if (bVar1) {
            this_local._4_4_ = 0x8235;
          }
          else {
            this_local._4_4_ = 0x822e;
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

glw::GLenum FunctionalTest::getDestinationFormatForChannel(TextureInternalFormatDescriptor descriptor)
{
	if (isFloatType(descriptor))
	{
		return GL_R32F;
	}

	if (isFixedUnsignedType(descriptor))
	{
		return GL_R16;
	}

	if (isFixedSignedType(descriptor))
	{
		return GL_R16_SNORM;
	}

	if (isIntegerUnsignedType(descriptor))
	{
		return GL_R32UI;
	}

	if (isIntegerSignedType(descriptor))
	{
		return GL_R32I;
	}

	return GL_R32F;
}